

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,int res_var,
          CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
          *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  long lVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  const_iterator cVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  NodeRange NVar10;
  key_type local_d8;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  local_d0;
  
  uVar8 = (ulong)res_var;
  lVar3 = *(long *)(this + 0x2b0);
  if (uVar8 < (ulong)(*(long *)(this + 0x2b8) - lVar3 >> 4)) {
    lVar7 = uVar8 * 0x10;
    plVar4 = *(long **)(lVar3 + lVar7);
    uVar2 = *(undefined4 *)(lVar3 + 8 + lVar7);
    (fc->super_FunctionalConstraint).result_var_ = res_var;
    local_d8._M_data = fc;
    cVar6 = std::
            _Hashtable<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>_>,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>_>,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this + 0x62f0),&local_d8);
    if ((cVar6.
         super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (iVar9 = *(int *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_int>,_true>
                               ._M_cur + 0x10), iVar9 < 0)) {
      local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)&local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
      paVar1 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
      if (paVar5 == paVar1) {
        local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
        _M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
             *(undefined8 *)
              ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
      }
      else {
        local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
        _M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
             (pointer)paVar5;
      }
      local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
           (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)paVar1;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
      local_d0.super_FunctionalConstraint.result_var_ = (fc->super_FunctionalConstraint).result_var_
      ;
      local_d0.super_FunctionalConstraint.ctx.value_ = (fc->super_FunctionalConstraint).ctx.value_;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
      _M_elems[0] = (_Type)(fc->
                           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                           ).args_._M_elems[0];
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 8);
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 0x10);
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data + 0x10) = (pointer)0x0;
      (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.pls_
      .breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data + 8) = (pointer)0x0;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 8);
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 0x10);
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.pls_
      .slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.X0_ = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                 params_.pls_.X0_;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.Y0_ = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                 params_.pls_.Y0_;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                 params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)
                   ((long)&(fc->
                           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                           ).params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8);
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.plp_
      .x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                 params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)
                   ((long)&(fc->
                           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                           ).params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8);
      local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.plp_
      .y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      *(pointer *)
       ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
               params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      NVar10 = AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
                         (this,&local_d0);
      NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)this,NVar10);
      iVar9 = NVar10.ir_.beg_;
      if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
          params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                        params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
          params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                        params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
          params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                        params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.pls_.slopes_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.pls_.slopes_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d0.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
          params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                        params_.pls_.breakpoints_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.pls_.breakpoints_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                              .params_.pls_.breakpoints_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
        operator_delete(local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                        _M_p,local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2
                             ._M_allocated_capacity + 1);
      }
    }
    lVar3 = *(long *)(this + 0x2b0);
    if (uVar8 < (ulong)(*(long *)(this + 0x2b8) - lVar3 >> 4)) {
      *(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        **)(lVar3 + lVar7) = this + 0x61a0;
      *(int *)(lVar3 + 8 + lVar7) = iVar9;
      (**(code **)(*plVar4 + 0xe8))(plVar4,uVar2);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }